

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage9_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rnding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  undefined8 *puVar1;
  long in_RDI;
  __m256i *in_XMM0_Qa;
  __m256i *palVar2;
  __m256i *palVar3;
  __m256i *in_XMM0_Qb;
  __m256i *palVar4;
  __m256i *palVar5;
  __m256i *in_YMM0_H;
  __m256i *palVar6;
  __m256i *palVar7;
  __m256i *in_register_00001218;
  __m256i *palVar8;
  __m256i temp3;
  __m256i temp2;
  __m256i temp1;
  int i;
  __m256i *in_stack_ffffffffffffff38;
  __m256i *clamp_hi_00;
  __m256i *in_stack_ffffffffffffff40;
  __m256i *clamp_lo_00;
  __m256i *in_stack_ffffffffffffff48;
  __m256i *out1;
  __m256i *in_stack_ffffffffffffff50;
  __m256i *rounding;
  __m256i *in_stack_ffffffffffffff58;
  __m256i *n1;
  __m256i *in_stack_ffffffffffffff60;
  __m256i *w1;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *n0;
  __m256i *in_stack_ffffffffffffff70;
  __m256i *w0;
  longlong in_stack_ffffffffffffff78;
  __m256i *palVar9;
  undefined1 in_stack_ffffffffffffff80 [24];
  int local_64;
  
  for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
    puVar1 = (undefined8 *)(in_RDI + (long)local_64 * 0x20);
    in_XMM0_Qa = (__m256i *)*puVar1;
    in_XMM0_Qb = (__m256i *)puVar1[1];
    in_YMM0_H = (__m256i *)puVar1[2];
    in_register_00001218 = (__m256i *)puVar1[3];
    in0[1] = in_stack_ffffffffffffff80._0_8_;
    in0[2] = in_stack_ffffffffffffff80._8_8_;
    in0[3] = in_stack_ffffffffffffff80._16_8_;
    in0[0] = in_stack_ffffffffffffff78;
    in1[1] = (longlong)in_stack_ffffffffffffff60;
    in1[0] = (longlong)in_stack_ffffffffffffff58;
    in1[2] = (longlong)in_stack_ffffffffffffff68;
    in1[3] = (longlong)in_stack_ffffffffffffff70;
    addsub_avx2(in0,in1,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  half_btf_avx2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  w1 = in_XMM0_Qa;
  n0 = in_XMM0_Qb;
  w0 = in_YMM0_H;
  palVar9 = in_register_00001218;
  half_btf_avx2(in_YMM0_H,in_XMM0_Qb,in_XMM0_Qa,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  clamp_lo_00 = in_XMM0_Qa;
  out1 = in_XMM0_Qb;
  rounding = in_YMM0_H;
  n1 = in_register_00001218;
  half_btf_avx2(w0,n0,w1,in_register_00001218,in_YMM0_H,(int)((ulong)in_XMM0_Qb >> 0x20));
  palVar2 = in_XMM0_Qa;
  palVar4 = in_XMM0_Qb;
  palVar6 = in_YMM0_H;
  clamp_hi_00 = in_register_00001218;
  half_btf_avx2(w0,n0,w1,n1,rounding,(int)((ulong)out1 >> 0x20));
  palVar3 = palVar2;
  palVar5 = palVar4;
  palVar7 = palVar6;
  palVar8 = in_register_00001218;
  half_btf_avx2(w0,n0,w1,n1,rounding,(int)((ulong)out1 >> 0x20));
  *(__m256i **)(in_RDI + 0x300) = palVar3;
  *(__m256i **)(in_RDI + 0x308) = palVar5;
  *(__m256i **)(in_RDI + 0x310) = palVar7;
  *(__m256i **)(in_RDI + 0x318) = palVar8;
  half_btf_avx2(w0,n0,w1,n1,rounding,(int)((ulong)out1 >> 0x20));
  *(__m256i **)(in_RDI + 800) = palVar3;
  *(__m256i **)(in_RDI + 0x328) = palVar5;
  *(__m256i **)(in_RDI + 0x330) = palVar7;
  *(__m256i **)(in_RDI + 0x338) = palVar8;
  half_btf_avx2(w0,n0,w1,n1,rounding,(int)((ulong)out1 >> 0x20));
  *(__m256i **)(in_RDI + 0x340) = palVar3;
  *(__m256i **)(in_RDI + 0x348) = palVar5;
  *(__m256i **)(in_RDI + 0x350) = palVar7;
  *(__m256i **)(in_RDI + 0x358) = palVar8;
  half_btf_avx2(w0,n0,w1,n1,rounding,(int)((ulong)out1 >> 0x20));
  *(__m256i **)(in_RDI + 0x360) = palVar3;
  *(__m256i **)(in_RDI + 0x368) = palVar5;
  *(__m256i **)(in_RDI + 0x370) = palVar7;
  *(__m256i **)(in_RDI + 0x378) = palVar8;
  *(__m256i **)(in_RDI + 0x280) = w1;
  *(__m256i **)(in_RDI + 0x288) = n0;
  *(__m256i **)(in_RDI + 0x290) = w0;
  *(__m256i **)(in_RDI + 0x298) = palVar9;
  *(__m256i **)(in_RDI + 0x2a0) = clamp_lo_00;
  *(__m256i **)(in_RDI + 0x2a8) = out1;
  *(__m256i **)(in_RDI + 0x2b0) = rounding;
  *(__m256i **)(in_RDI + 0x2b8) = n1;
  *(__m256i **)(in_RDI + 0x2c0) = in_XMM0_Qa;
  *(__m256i **)(in_RDI + 0x2c8) = in_XMM0_Qb;
  *(__m256i **)(in_RDI + 0x2d0) = in_YMM0_H;
  *(__m256i **)(in_RDI + 0x2d8) = clamp_hi_00;
  *(__m256i **)(in_RDI + 0x2e0) = palVar2;
  *(__m256i **)(in_RDI + 0x2e8) = palVar4;
  *(__m256i **)(in_RDI + 0x2f0) = palVar6;
  *(__m256i **)(in_RDI + 0x2f8) = in_register_00001218;
  for (local_64 = 0x20; local_64 < 0x28; local_64 = local_64 + 1) {
    in0_00[1] = in_stack_ffffffffffffff80._0_8_;
    in0_00[2] = in_stack_ffffffffffffff80._8_8_;
    in0_00[3] = in_stack_ffffffffffffff80._16_8_;
    in0_00[0] = (longlong)palVar9;
    in1_00[1] = (longlong)w1;
    in1_00[0] = (longlong)n1;
    in1_00[2] = (longlong)n0;
    in1_00[3] = (longlong)w0;
    addsub_avx2(in0_00,in1_00,rounding,out1,clamp_lo_00,clamp_hi_00);
  }
  for (local_64 = 0x30; local_64 < 0x38; local_64 = local_64 + 1) {
    in0_01[1] = in_stack_ffffffffffffff80._0_8_;
    in0_01[2] = in_stack_ffffffffffffff80._8_8_;
    in0_01[3] = in_stack_ffffffffffffff80._16_8_;
    in0_01[0] = (longlong)palVar9;
    in1_01[1] = (longlong)w1;
    in1_01[0] = (longlong)n1;
    in1_01[2] = (longlong)n0;
    in1_01[3] = (longlong)w0;
    addsub_avx2(in0_01,in1_01,rounding,out1,clamp_lo_00,clamp_hi_00);
  }
  return;
}

Assistant:

static inline void idct64_stage9_avx2(__m256i *u, const __m256i *cospim32,
                                      const __m256i *cospi32,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi,
                                      const __m256i *rnding, int bit) {
  int i;
  __m256i temp1, temp2, temp3, temp4;
  for (i = 0; i < 8; ++i) {
    addsub_avx2(u[i], u[15 - i], &u[i], &u[15 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_avx2(cospim32, &u[20], cospi32, &u[27], rnding, bit);
  temp2 = half_btf_avx2(cospim32, &u[21], cospi32, &u[26], rnding, bit);
  temp3 = half_btf_avx2(cospim32, &u[22], cospi32, &u[25], rnding, bit);
  temp4 = half_btf_avx2(cospim32, &u[23], cospi32, &u[24], rnding, bit);
  u[24] = half_btf_avx2(cospi32, &u[23], cospi32, &u[24], rnding, bit);
  u[25] = half_btf_avx2(cospi32, &u[22], cospi32, &u[25], rnding, bit);
  u[26] = half_btf_avx2(cospi32, &u[21], cospi32, &u[26], rnding, bit);
  u[27] = half_btf_avx2(cospi32, &u[20], cospi32, &u[27], rnding, bit);
  u[20] = temp1;
  u[21] = temp2;
  u[22] = temp3;
  u[23] = temp4;
  for (i = 32; i < 40; i++) {
    addsub_avx2(u[i], u[i ^ 15], &u[i], &u[i ^ 15], clamp_lo, clamp_hi);
  }

  for (i = 48; i < 56; i++) {
    addsub_avx2(u[i ^ 15], u[i], &u[i ^ 15], &u[i], clamp_lo, clamp_hi);
  }
}